

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O0

bool __thiscall QSharedMemory::lock(QSharedMemory *this)

{
  bool bVar1;
  QSharedMemoryPrivate *pQVar2;
  long in_FS_OFFSET;
  QSharedMemoryPrivate *d;
  QLatin1StringView function;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  char *s;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff74;
  QString *in_stack_ffffffffffffff78;
  bool local_6b;
  QChar local_6a;
  char local_68 [38];
  QChar in_stack_ffffffffffffffbe;
  QMessageLogger local_28;
  long local_8;
  int fieldWidth;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSharedMemory *)0x26111b);
  if ((pQVar2->lockedByMe & 1U) == 0) {
    bVar1 = QSystemSemaphore::acquire((QSystemSemaphore *)0x261175);
    if (bVar1) {
      pQVar2->lockedByMe = true;
      local_6b = true;
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_ffffffffffffff68,
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      uVar3 = 0;
      s = local_68;
      tr(s,(char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
         in_stack_ffffffffffffff5c);
      fieldWidth = (int)((ulong)s >> 0x20);
      QChar::QChar<char16_t,_true>(&local_6a,L' ');
      QString::arg<QLatin1String,_true>
                (in_stack_ffffffffffffff78,
                 (QLatin1String *)CONCAT44(in_stack_ffffffffffffff74,uVar3),fieldWidth,
                 in_stack_ffffffffffffffbe);
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x26122a);
      QString::~QString((QString *)0x261234);
      pQVar2->error = LockError;
      local_6b = false;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QMessageLogger::warning(&local_28,"QSharedMemory::lock: already locked");
    local_6b = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_6b;
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemory::lock()
{
    Q_D(QSharedMemory);
    if (d->lockedByMe) {
        qWarning("QSharedMemory::lock: already locked");
        return true;
    }
    if (d->systemSemaphore.acquire()) {
        d->lockedByMe = true;
        return true;
    }
    const auto function = "QSharedMemory::lock"_L1;
    d->errorString = QSharedMemory::tr("%1: unable to lock").arg(function);
    d->error = QSharedMemory::LockError;
    return false;
}